

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

uint16_t anon_unknown.dwarf_aa827f::mapped_colour(uint8_t source)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined2 local_1a;
  uint8_t parts [2];
  int blue;
  int green;
  int red;
  uint8_t source_local;
  
  uVar1 = (source & 1) << 2 | (int)(source & 8) >> 2 | (int)(source & 0x40) >> 6;
  uVar2 = (source & 2) << 1 | (int)(source & 0x10) >> 3 | (int)(source & 0x80) >> 7;
  uVar3 = (int)(source & 4) >> 1 | (int)(source & 0x20) >> 5;
  if (7 < uVar1) {
    __assert_fail("red <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                  ,0x15,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
  }
  if (7 < uVar2) {
    __assert_fail("green <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                  ,0x16,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
  }
  if (3 < uVar3) {
    __assert_fail("blue <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                  ,0x17,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
  }
  uVar1 = uVar1 * 2;
  uVar3 = uVar3 * 5;
  if (uVar1 < 0x10) {
    if (0xf < uVar2 * 2) {
      __assert_fail("green <= 15",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                    ,0x1e,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
    }
    if (uVar3 < 0x10) {
      local_1a = CONCAT11((char)(uVar2 << 5) + (char)uVar3,(char)uVar1);
      return local_1a;
    }
    __assert_fail("blue <= 15",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                  ,0x1f,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
  }
  __assert_fail("red <= 15",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Enterprise/Nick.cpp"
                ,0x1d,"uint16_t (anonymous namespace)::mapped_colour(uint8_t)");
}

Assistant:

uint16_t mapped_colour(uint8_t source) {
	// On the Enterprise, red and green are 3-bit quantities; blue is a 2-bit quantity.
	int red		= ((source&0x01) << 2) | ((source&0x08) >> 2) | ((source&0x40) >> 6);
	int green	= ((source&0x02) << 1) | ((source&0x10) >> 3) | ((source&0x80) >> 7);
	int blue	= ((source&0x04) >> 1) | ((source&0x20) >> 5);

	assert(red <= 7);
	assert(green <= 7);
	assert(blue <= 3);

	red = (red << 1) + (red >> 3);
	green = (green << 1) + (green >> 3);
	blue = (blue << 2) + blue;

	assert(red <= 15);
	assert(green <= 15);
	assert(blue <= 15);

	// Duplicate bits where necessary to map to a full 4-bit range per channel.
	const uint8_t parts[2] = {
		uint8_t(
			red
		),
		uint8_t(
			(green << 4) + blue
		)
	};
	return *reinterpret_cast<const uint16_t *>(parts);
}